

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_String.cc
# Opt level: O0

bool __thiscall QPDF_String::useHexString(QPDF_String *this)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  ulong uVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  char ch;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  uint non_ascii;
  QPDF_String *this_local;
  
  __range1._4_4_ = 0;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_38._M_current = (char *)std::__cxx11::string::end();
  do {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8);
    if (!bVar2) {
      uVar4 = std::__cxx11::string::length();
      return uVar4 < (uint)(__range1._4_4_ * 5);
    }
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar3;
    if (cVar1 < '\x7f') {
      if (cVar1 < ' ') {
        if ((cVar1 < '\0') || ('\x17' < cVar1)) {
          __range1._4_4_ = __range1._4_4_ + 1;
        }
        else if ((((cVar1 != '\n') && (cVar1 != '\r')) && (cVar1 != '\t')) &&
                ((cVar1 != '\b' && (cVar1 != '\f')))) {
          return true;
        }
      }
    }
    else {
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool
QPDF_String::useHexString() const
{
    // Heuristic: use the hexadecimal representation of a string if there are any non-printable (in
    // PDF Doc encoding) characters or if too large of a proportion of the string consists of
    // non-ASCII characters.
    unsigned int non_ascii = 0;
    for (auto const ch: this->val) {
        if (ch > 126) {
            ++non_ascii;
        } else if (ch >= 32) {
            continue;
        } else if (ch < 0 || ch >= 24) {
            ++non_ascii;
        } else if (!(ch == '\n' || ch == '\r' || ch == '\t' || ch == '\b' || ch == '\f')) {
            return true;
        }
    }
    return 5 * non_ascii > val.length();
}